

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O0

lws_parser_return_t lws_parse(lws *wsi,uchar *buf,int *len)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  char *__nptr;
  int *piVar5;
  ulong uVar6;
  bool bVar7;
  size_t local_d8;
  char *pv;
  char local_98 [4];
  int uhlen;
  char dotstar [64];
  int local_4c;
  int pos;
  int r;
  uint uStack_3c;
  uchar c;
  uint m;
  uint n;
  lws_context *context;
  allocated_headers *ah;
  int *len_local;
  uchar *buf_local;
  lws *wsi_local;
  
  context = (lws_context *)(wsi->http).ah;
  _m = (wsi->a).context;
  ah = (allocated_headers *)len;
  len_local = (int *)buf;
  buf_local = (uchar *)wsi;
  if ((wsi->http).ah == (allocated_headers *)0x0) {
    __assert_fail("wsi->http.ah",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/roles/http/parsers.c"
                  ,0x3e4,"lws_parser_return_t lws_parse(struct lws *, unsigned char *, int *)");
  }
  do {
    *(int *)&ah->next = *(int *)&ah->next + -1;
    piVar5 = (int *)((long)len_local + 1);
    pos._3_1_ = (byte)*len_local;
    len_local = piVar5;
    switch(*(undefined1 *)&context->pt[0].pipe_wsi) {
    case 0x61:
      _lws_log(0x20,"WSI_TOKEN_NAME_PART \'%c\' 0x%02X (role=0x%lx) wsi->lextable_pos=%d\n",
               (ulong)pos._3_1_,(ulong)pos._3_1_,(ulong)(*(uint *)(buf_local + 0x454) & 0xffff0000),
               (ulong)(uint)(int)(short)context->pt[0].dummy_pipe_fds[0]);
      if ((*(int *)&context->pt[0].fds == 0) && (pos._3_1_ == 10)) {
LAB_0012b0fc:
        if (*(char *)((long)context->pt[0].dummy_pipe_fds + 5) == '\0') {
          iVar4 = lws_hdr_total_length((lws *)buf_local,WSI_TOKEN_UPGRADE);
          if (iVar4 != 0) {
            __nptr = lws_hdr_simple_ptr((lws *)buf_local,WSI_TOKEN_VERSION);
            if (__nptr != (char *)0x0) {
              iVar4 = atoi(__nptr);
              buf_local[0x483] = (uchar)iVar4;
            }
            _lws_log(0x20,"v%02d hdrs done\n",(ulong)(uint)(int)(char)buf_local[0x483]);
          }
          *(undefined1 *)&context->pt[0].pipe_wsi = 0x65;
          *(ulong *)(buf_local + 0x46e) = *(ulong *)(buf_local + 0x46e) & 0xfffffffffffffffe | 1;
          return LPR_OK;
        }
LAB_0012b1a7:
        _lws_log(8," forbidding on uri sanitation\n");
        lws_return_http_status((lws *)buf_local,0x193,(char *)0x0);
        return LPR_FORBIDDEN;
      }
      if ((0x40 < pos._3_1_) && (pos._3_1_ < 0x5b)) {
        pos._3_1_ = pos._3_1_ + 0x20;
      }
      if (((*(ulong *)(buf_local + 0x46e) >> 1 & 1) == 0) && (*(int *)&context->pt[0].fds == 0)) {
        *(undefined4 *)&context->pt[0].fds = *(undefined4 *)((long)&context->pt[0].context + 4);
        for (uStack_3c = 0; uStack_3c < 8; uStack_3c = uStack_3c + 1) {
          iVar4 = lws_pos_in_bounds((lws *)buf_local);
          if (iVar4 == 0) {
            lVar3 = *(long *)(context->canonical_hostname + 0x10);
            uVar2 = *(uint *)((long)&context->pt[0].context + 4);
            *(uint *)((long)&context->pt[0].context + 4) = uVar2 + 1;
            *(undefined1 *)(lVar3 + (ulong)uVar2) = 0;
          }
        }
      }
      iVar4 = lws_pos_in_bounds((lws *)buf_local);
      if (iVar4 != 0) {
        return LPR_FAIL;
      }
      lVar3 = *(long *)(context->canonical_hostname + 0x10);
      uVar2 = *(uint *)((long)&context->pt[0].context + 4);
      *(uint *)((long)&context->pt[0].context + 4) = uVar2 + 1;
      *(byte *)(lVar3 + (ulong)uVar2) = pos._3_1_;
      local_4c = (int)(short)context->pt[0].dummy_pipe_fds[0];
      if ((((*(ulong *)(buf_local + 0x46e) >> 1 & 1) == 0) && (local_4c < 0)) && (pos._3_1_ == 0x3a)
         ) {
        if (*(int *)&context->pt[0].foreign_pfd_list == 0) {
          *(undefined4 *)&context->pt[0].foreign_pfd_list = *(undefined4 *)&context->pt[0].fds;
        }
        if (*(int *)((long)&context->pt[0].foreign_pfd_list + 4) != 0) {
          lws_ser_wu32be((uint8_t *)
                         (*(long *)(context->canonical_hostname + 0x10) +
                         (ulong)(*(int *)((long)&context->pt[0].foreign_pfd_list + 4) + 4)),
                         *(uint32_t *)&context->pt[0].fds);
        }
        *(undefined4 *)((long)&context->pt[0].foreign_pfd_list + 4) =
             *(undefined4 *)&context->pt[0].fds;
        iVar4 = *(int *)((long)&context->pt[0].context + 4) - (*(int *)&context->pt[0].fds + 8);
        if (iVar4 + 1U < 0x40) {
          local_d8 = (size_t)(iVar4 + 1);
        }
        else {
          local_d8 = 0x40;
        }
        lws_strncpy(local_98,(char *)(*(long *)(context->canonical_hostname + 0x10) +
                                     (ulong)(*(int *)&context->pt[0].fds + 8)),local_d8);
        _lws_log(0x10,"%s: unk header %d \'%s\'\n","lws_parse",
                 (ulong)(uint)(*(int *)((long)&context->pt[0].context + 4) -
                              (*(int *)&context->pt[0].fds + 8)),local_98);
        lws_ser_wu16be((uint8_t *)
                       (*(long *)(context->canonical_hostname + 0x10) +
                       (ulong)*(uint *)&context->pt[0].fds),
                       ((short)*(undefined4 *)((long)&context->pt[0].context + 4) -
                       (short)*(undefined4 *)&context->pt[0].fds) - 8);
        *(undefined4 *)((long)&context->pt[0].fds + 4) =
             *(undefined4 *)((long)&context->pt[0].context + 4);
        *(undefined1 *)&context->pt[0].pipe_wsi = 0x62;
      }
      else if (-1 < local_4c) {
        while (("g@"[local_4c] & 0x80) == 0) {
          if ("g@"[local_4c] == '\b') goto LAB_0012aa5a;
          if ("g@"[local_4c] < 8) {
            if ((*(ulong *)(buf_local + 0x46e) >> 1 & 1) == 0) {
              *(undefined4 *)((long)&context->pt[0].context + 4) =
                   *(undefined4 *)&context->pt[0].fds;
              *(undefined4 *)&context->pt[0].fds = 0;
            }
            *(short *)context->pt[0].dummy_pipe_fds = (short)local_4c;
            goto LAB_0012ab7e;
          }
          if ("g@"[local_4c] == pos._3_1_) {
            *(ushort *)context->pt[0].dummy_pipe_fds =
                 (short)local_4c + (ushort)"g@"[local_4c + 1] + (ushort)"g@"[local_4c + 2] * 0x100;
            goto LAB_0012ab7e;
          }
          local_4c = local_4c + 3;
        }
        if ((("g@"[local_4c] & 0x7f) == pos._3_1_) && ("g@"[local_4c + 1] != '\b')) {
          *(short *)context->pt[0].dummy_pipe_fds = (short)(local_4c + 1);
        }
        else {
LAB_0012aa5a:
          *(undefined2 *)context->pt[0].dummy_pipe_fds = 0xffff;
        }
LAB_0012ab7e:
        if ((((short)context->pt[0].dummy_pipe_fds[0] < 0) &&
            (*(lws_role_ops **)(buf_local + 0x360) == &role_ops_h1)) &&
           ((*(uint *)(buf_local + 0x454) & 0x20000000) != 0)) {
          for (r = 0; (uint)r < 8; r = r + 1) {
            if (*(char *)((long)&(((lws_sorted_usec_list_t *)(context->pt[0].pt_sul_owner + 4))->
                                 list).prev + (ulong)""[(uint)r]) != '\0') {
              if ((*(ulong *)(buf_local + 0x46e) >> 1 & 1) != 0) {
                *(undefined1 *)&context->pt[0].pipe_wsi = 99;
              }
              break;
            }
          }
          if (r == 8) {
            if ((*(ulong *)(*(long *)(buf_local + 8) + 0x1d8) & 0x100000) == 0x100000) {
              _lws_log(4,"%s: http fail fallback\n","lws_parse");
              return LPR_DO_FALLBACK;
            }
            _lws_log(8,"Unknown method - dropping\n");
            goto LAB_0012b1a7;
          }
          if ((*(ulong *)(buf_local + 0x46e) >> 1 & 1) == 0) {
LAB_0012ae91:
            if ((*(ulong *)(buf_local + 0x46e) >> 1 & 1) != 0) goto LAB_0012aeaf;
          }
        }
        else if ((short)context->pt[0].dummy_pipe_fds[0] < 0) {
          if ((*(ulong *)(buf_local + 0x46e) >> 1 & 1) == 0) goto LAB_0012ae91;
          *(undefined1 *)&context->pt[0].pipe_wsi = 99;
        }
        else if ("g@"[(short)context->pt[0].dummy_pipe_fds[0]] < 8) {
          uStack_3c = (uint)CONCAT11("g@"[(short)context->pt[0].dummy_pipe_fds[0]],
                                     "g@"[(short)context->pt[0].dummy_pipe_fds[0] + 1]);
          _lws_log(0x20,"known hdr %d\n",(ulong)uStack_3c);
          for (r = 0; (uint)r < 8; r = r + 1) {
            if ((uStack_3c == ""[(uint)r]) &&
               (*(char *)((long)&(((lws_sorted_usec_list_t *)(context->pt[0].pt_sul_owner + 4))->
                                 list).prev + (ulong)""[(uint)r]) != '\0')) {
              _lws_log(2,"Duplicated method\n");
              return LPR_FAIL;
            }
          }
          if ((*(ulong *)(buf_local + 0x46e) >> 1 & 1) == 0) {
            *(undefined4 *)((long)&context->pt[0].context + 4) = *(undefined4 *)&context->pt[0].fds;
            *(undefined4 *)&context->pt[0].fds = 0;
          }
          if (uStack_3c == 0x22) {
            uStack_3c = 6;
          }
          *(char *)&context->pt[0].pipe_wsi = (char)uStack_3c;
          *(undefined1 *)(context->pt[0].dummy_pipe_fds + 1) = 0;
          if (_m->token_limits == (lws_token_limits *)0x0) {
            *(undefined4 *)((long)&context->pt[0].serv_buf + 4) =
                 *(undefined4 *)(*(long *)buf_local + 0x7a0);
          }
          else {
            *(uint *)((long)&context->pt[0].serv_buf + 4) =
                 (uint)_m->token_limits->token_limit[*(byte *)&context->pt[0].pipe_wsi];
          }
          if (*(char *)&context->pt[0].pipe_wsi != '\b') goto LAB_0012aeaf;
          goto LAB_0012b0fc;
        }
      }
      break;
    case 0x62:
      if (pos._3_1_ != 0xd) {
        if (pos._3_1_ == 10) {
          lws_ser_wu16be((uint8_t *)
                         (*(long *)(context->canonical_hostname + 0x10) +
                         (ulong)(*(int *)&context->pt[0].fds + 2)),
                         (short)*(undefined4 *)((long)&context->pt[0].context + 4) -
                         (short)*(undefined4 *)((long)&context->pt[0].fds + 4));
          *(undefined1 *)&context->pt[0].pipe_wsi = 0x61;
          *(undefined4 *)&context->pt[0].fds = 0;
          *(undefined2 *)context->pt[0].dummy_pipe_fds = 0;
        }
        else if ((*(int *)((long)&context->pt[0].context + 4) !=
                  *(int *)((long)&context->pt[0].fds + 4)) ||
                ((pos._3_1_ != 0x20 && (pos._3_1_ != 9)))) {
          iVar4 = lws_pos_in_bounds((lws *)buf_local);
          if (iVar4 != 0) {
            return LPR_FAIL;
          }
          lVar3 = *(long *)(context->canonical_hostname + 0x10);
          uVar2 = *(uint *)((long)&context->pt[0].context + 4);
          *(uint *)((long)&context->pt[0].context + 4) = uVar2 + 1;
          *(byte *)(lVar3 + (ulong)uVar2) = pos._3_1_;
        }
      }
      break;
    case 99:
      _lws_log(0x20,"WSI_TOKEN_SKIPPING \'%c\'\n",(ulong)pos._3_1_);
      if (pos._3_1_ == 10) {
        *(undefined1 *)&context->pt[0].pipe_wsi = 0x61;
        *(undefined4 *)&context->pt[0].fds = 0;
        *(undefined2 *)context->pt[0].dummy_pipe_fds = 0;
      }
      if (pos._3_1_ == 0xd) {
        *(undefined1 *)&context->pt[0].pipe_wsi = 100;
      }
      break;
    case 100:
      _lws_log(0x20,"WSI_TOKEN_SKIPPING_SAW_CR \'%c\'\n",(ulong)pos._3_1_);
      if (*(char *)((long)context->pt[0].dummy_pipe_fds + 5) != '\0') goto LAB_0012b1a7;
      if (pos._3_1_ == 10) {
        *(undefined1 *)&context->pt[0].pipe_wsi = 0x61;
        *(undefined4 *)&context->pt[0].fds = 0;
        *(undefined2 *)context->pt[0].dummy_pipe_fds = 0;
      }
      else {
        *(undefined1 *)&context->pt[0].pipe_wsi = 99;
      }
      break;
    case 0x65:
      _lws_log(0x20,"WSI_PARSING_COMPLETE \'%c\'\n",(ulong)pos._3_1_);
      break;
    default:
      _lws_log(0x20,"WSI_TOK_(%d) \'%c\'\n",(ulong)*(byte *)&context->pt[0].pipe_wsi,
               (ulong)pos._3_1_);
      if ((*(short *)(context->canonical_hostname +
                     (ulong)*(byte *)((long)&(((lws_sorted_usec_list_t *)
                                              (context->pt[0].pt_sul_owner + 4))->list).prev +
                                     (ulong)*(byte *)&context->pt[0].pipe_wsi) * 8 + 0x20) != 0) ||
         (pos._3_1_ != 0x20)) {
        for (r = 0; ((uint)r < 8 && (*(uchar *)&context->pt[0].pipe_wsi != ""[(uint)r])); r = r + 1)
        {
        }
        if (r == 8) {
LAB_0012a5ef:
          if ((*(char *)&context->pt[0].pipe_wsi != '\b') &&
             ((pos._3_1_ == 0xd || (pos._3_1_ == 10)))) {
            if (*(char *)((long)context->pt[0].dummy_pipe_fds + 5) != '\0') goto LAB_0012b1a7;
            if (pos._3_1_ == 10) {
              *(undefined1 *)&context->pt[0].pipe_wsi = 0x61;
              *(undefined4 *)&context->pt[0].fds = 0;
              *(undefined2 *)context->pt[0].dummy_pipe_fds = 0;
            }
            else {
              *(undefined1 *)&context->pt[0].pipe_wsi = 100;
            }
            pos._3_1_ = 0;
            _lws_log(0x20,"*\n");
          }
          uStack_3c = issue_char((lws *)buf_local,pos._3_1_);
          if ((int)uStack_3c < 0) {
            return LPR_FAIL;
          }
          if (uStack_3c == 0) {
            if ((pos._3_1_ == 0) && (*(char *)&context->pt[0].pipe_wsi != 'L')) {
              *(short *)(*(long *)(buf_local + 0x40) + 0x20 +
                        (ulong)*(byte *)(*(long *)(buf_local + 0x40) + 0x3cb) * 8) =
                   *(short *)(*(long *)(buf_local + 0x40) + 0x20 +
                             (ulong)*(byte *)(*(long *)(buf_local + 0x40) + 0x3cb) * 8) + -1;
            }
          }
          else {
            *(undefined1 *)&context->pt[0].pipe_wsi = 99;
          }
LAB_0012a6ed:
          if (*(char *)&context->pt[0].pipe_wsi == '\b') goto LAB_0012b0fc;
        }
        else {
          if (pos._3_1_ == 0x20) {
            if ((*(short *)(context->canonical_hostname +
                           (ulong)*(byte *)((long)context->pt[0].dummy_pipe_fds + 3) * 8 + 0x20) ==
                 0) && (iVar4 = issue_char((lws *)buf_local,'/'), iVar4 < 0)) {
              return LPR_FAIL;
            }
            if (((char)context->pt[0].dummy_pipe_fds[1] == '\x03') &&
               (2 < *(ushort *)
                     (context->canonical_hostname +
                     (ulong)*(byte *)((long)context->pt[0].dummy_pipe_fds + 3) * 8 + 0x20))) {
              *(int *)((long)&context->pt[0].context + 4) =
                   *(int *)((long)&context->pt[0].context + 4) + -1;
              uVar6 = (ulong)*(byte *)((long)context->pt[0].dummy_pipe_fds + 3);
              *(short *)(context->canonical_hostname + uVar6 * 8 + 0x20) =
                   *(short *)(context->canonical_hostname + uVar6 * 8 + 0x20) + -1;
              do {
                *(int *)((long)&context->pt[0].context + 4) =
                     *(int *)((long)&context->pt[0].context + 4) + -1;
                uVar6 = (ulong)*(byte *)((long)context->pt[0].dummy_pipe_fds + 3);
                *(short *)(context->canonical_hostname + uVar6 * 8 + 0x20) =
                     *(short *)(context->canonical_hostname + uVar6 * 8 + 0x20) + -1;
                bVar7 = false;
                if (1 < *(ushort *)
                         (context->canonical_hostname +
                         (ulong)*(byte *)((long)context->pt[0].dummy_pipe_fds + 3) * 8 + 0x20)) {
                  bVar7 = *(char *)(*(long *)(context->canonical_hostname + 0x10) +
                                   (ulong)*(uint *)((long)&context->pt[0].context + 4)) != '/';
                }
              } while (bVar7);
            }
            iVar4 = issue_char((lws *)buf_local,'\0');
            if (iVar4 < 0) {
              return LPR_FAIL;
            }
            *(short *)(*(long *)(buf_local + 0x40) + 0x20 +
                      (ulong)*(byte *)(*(long *)(buf_local + 0x40) + 0x3cb) * 8) =
                 *(short *)(*(long *)(buf_local + 0x40) + 0x20 +
                           (ulong)*(byte *)(*(long *)(buf_local + 0x40) + 0x3cb) * 8) + -1;
            *(undefined1 *)&context->pt[0].pipe_wsi = 0xf;
LAB_0012aeaf:
            *(char *)((long)context->pt[0].dummy_pipe_fds + 3) =
                 *(char *)((long)context->pt[0].dummy_pipe_fds + 3) + '\x01';
          }
          else {
            iVar4 = lws_parse_urldecode((lws *)buf_local,(uint8_t *)((long)&pos + 3));
            switch(iVar4) {
            case 0:
              goto LAB_0012a5ef;
            case 1:
              goto LAB_0012a6ed;
            case 2:
              goto LAB_0012b1a7;
            case 3:
              break;
            default:
              return LPR_FAIL;
            }
          }
          if (*(char *)((long)context->pt[0].dummy_pipe_fds + 3) == '`') {
            _lws_log(2,"More hdr frags than we can deal with\n");
            return LPR_FAIL;
          }
          *(undefined4 *)
           (context->canonical_hostname +
           (ulong)*(byte *)((long)context->pt[0].dummy_pipe_fds + 3) * 8 + 0x1c) =
               *(undefined4 *)((long)&context->pt[0].context + 4);
          bVar1 = *(byte *)((long)context->pt[0].dummy_pipe_fds + 3);
          (context->canonical_hostname + (ulong)bVar1 * 8 + 0x20)[0] = '\0';
          (context->canonical_hostname + (ulong)bVar1 * 8 + 0x20)[1] = '\0';
          context->canonical_hostname
          [(ulong)*(byte *)((long)context->pt[0].dummy_pipe_fds + 3) * 8 + 0x22] = '\0';
          context->canonical_hostname
          [(ulong)*(byte *)((long)context->pt[0].dummy_pipe_fds + 3) * 8 + 0x23] = '\x02';
          uStack_3c = (uint)*(byte *)((long)&(((lws_sorted_usec_list_t *)
                                              (context->pt[0].pt_sul_owner + 4))->list).prev +
                                     (ulong)*(byte *)&context->pt[0].pipe_wsi);
          if (uStack_3c == 0) {
            *(undefined1 *)
             ((long)&(((lws_sorted_usec_list_t *)(context->pt[0].pt_sul_owner + 4))->list).prev +
             (ulong)*(byte *)&context->pt[0].pipe_wsi) =
                 *(undefined1 *)((long)context->pt[0].dummy_pipe_fds + 3);
            *(uint *)&context->pt[0].context = (uint)*(byte *)&context->pt[0].pipe_wsi;
          }
          else {
            while (context->canonical_hostname[(ulong)uStack_3c * 8 + 0x22] != '\0') {
              uStack_3c = (uint)(byte)context->canonical_hostname[(ulong)uStack_3c * 8 + 0x22];
            }
            context->canonical_hostname[(ulong)uStack_3c * 8 + 0x22] =
                 *(char *)((long)context->pt[0].dummy_pipe_fds + 3);
            iVar4 = issue_char((lws *)buf_local,' ');
            if (iVar4 < 0) {
              return LPR_FAIL;
            }
          }
        }
      }
    }
    if (*(int *)&ah->next == 0) {
      return LPR_OK;
    }
  } while( true );
}

Assistant:

lws_parser_return_t LWS_WARN_UNUSED_RESULT
lws_parse(struct lws *wsi, unsigned char *buf, int *len)
{
	struct allocated_headers *ah = wsi->http.ah;
	struct lws_context *context = wsi->a.context;
	unsigned int n, m;
	unsigned char c;
	int r, pos;

	assert(wsi->http.ah);

	do {
		(*len)--;
		c = *buf++;

		switch (ah->parser_state) {
#if defined(LWS_WITH_CUSTOM_HEADERS)
		case WSI_TOKEN_UNKNOWN_VALUE_PART:

			if (c == '\r')
				break;
			if (c == '\n') {
				lws_ser_wu16be((uint8_t *)&ah->data[ah->unk_pos + 2],
					       (uint16_t)(ah->pos - ah->unk_value_pos));
				ah->parser_state = WSI_TOKEN_NAME_PART;
				ah->unk_pos = 0;
				ah->lextable_pos = 0;
				break;
			}

			/* trim leading whitespace */
			if (ah->pos != ah->unk_value_pos ||
			    (c != ' ' && c != '\t')) {

				if (lws_pos_in_bounds(wsi))
					return LPR_FAIL;

				ah->data[ah->pos++] = (char)c;
			}
			pos = ah->lextable_pos;
			break;
#endif
		default:

			lwsl_parser("WSI_TOK_(%d) '%c'\n", ah->parser_state, c);

			/* collect into malloc'd buffers */
			/* optional initial space swallow */
			if (!ah->frags[ah->frag_index[ah->parser_state]].len &&
			    c == ' ')
				break;

			for (m = 0; m < LWS_ARRAY_SIZE(methods); m++)
				if (ah->parser_state == methods[m])
					break;
			if (m == LWS_ARRAY_SIZE(methods))
				/* it was not any of the methods */
				goto check_eol;

			/* special URI processing... end at space */

			if (c == ' ') {
				/* enforce starting with / */
				if (!ah->frags[ah->nfrag].len)
					if (issue_char(wsi, '/') < 0)
						return LPR_FAIL;

				if (ah->ups == URIPS_SEEN_SLASH_DOT_DOT) {
					/*
					 * back up one dir level if possible
					 * safe against header fragmentation
					 * because the method URI can only be
					 * in 1 fragment
					 */
					if (ah->frags[ah->nfrag].len > 2) {
						ah->pos--;
						ah->frags[ah->nfrag].len--;
						do {
							ah->pos--;
							ah->frags[ah->nfrag].len--;
						} while (ah->frags[ah->nfrag].len > 1 &&
							 ah->data[ah->pos] != '/');
					}
				}

				/* begin parsing HTTP version: */
				if (issue_char(wsi, '\0') < 0)
					return LPR_FAIL;
				/* don't account for it */
				wsi->http.ah->frags[wsi->http.ah->nfrag].len--;
				ah->parser_state = WSI_TOKEN_HTTP;
				goto start_fragment;
			}

			r = lws_parse_urldecode(wsi, &c);
			switch (r) {
			case LPUR_CONTINUE:
				break;
			case LPUR_SWALLOW:
				goto swallow;
			case LPUR_FORBID:
				goto forbid;
			case LPUR_EXCESSIVE:
				goto excessive;
			default:
				return LPR_FAIL;
			}
check_eol:
			/* bail at EOL */
			if (ah->parser_state != WSI_TOKEN_CHALLENGE &&
			    (c == '\x0d' || c == '\x0a')) {
				if (ah->ues != URIES_IDLE)
					goto forbid;

				if (c == '\x0a') {
					/* broken peer */
					ah->parser_state = WSI_TOKEN_NAME_PART;
					ah->unk_pos = 0;
					ah->lextable_pos = 0;
				} else
					ah->parser_state = WSI_TOKEN_SKIPPING_SAW_CR;

				c = '\0';
				lwsl_parser("*\n");
			}

			n = (unsigned int)issue_char(wsi, c);
			if ((int)n < 0)
				return LPR_FAIL;
			if (n > 0)
				ah->parser_state = WSI_TOKEN_SKIPPING;
			else {
				/*
				 * Explicit zeroes are legal in URI ARGS.
				 * They can only exist as a safety terminator
				 * after the valid part of the token contents
				 * for other types.
				 */
				if (!c && ah->parser_state != WSI_TOKEN_HTTP_URI_ARGS)
					/* don't account for safety terminator */
					wsi->http.ah->frags[wsi->http.ah->nfrag].len--;
			}

swallow:
			/* per-protocol end of headers management */

			if (ah->parser_state == WSI_TOKEN_CHALLENGE)
				goto set_parsing_complete;
			break;

			/* collecting and checking a name part */
		case WSI_TOKEN_NAME_PART:
			lwsl_parser("WSI_TOKEN_NAME_PART '%c' 0x%02X "
				    "(role=0x%lx) "
				    "wsi->lextable_pos=%d\n", c, c,
				    (unsigned long)lwsi_role(wsi),
				    ah->lextable_pos);

			if (!ah->unk_pos && c == '\x0a')
				/* broken peer */
				goto set_parsing_complete;

			if (c >= 'A' && c <= 'Z')
				c = (unsigned char)(c + 'a' - 'A');
			/*
			 * ...in case it's an unknown header, speculatively
			 * store it as the name comes in.  If we recognize it as
			 * a known header, we'll snip this.
			 */

			if (!wsi->mux_substream && !ah->unk_pos) {
				ah->unk_pos = ah->pos;

#if defined(LWS_WITH_CUSTOM_HEADERS)
				/*
				 * Prepare new unknown header linked-list entry
				 *
				 *  - 16-bit BE: name part length
				 *  - 16-bit BE: value part length
				 *  - 32-bit BE: data offset of next, or 0
				 */
				for (n = 0; n < 8; n++)
					if (!lws_pos_in_bounds(wsi))
						ah->data[ah->pos++] = 0;
#endif
			}

			if (lws_pos_in_bounds(wsi))
				return LPR_FAIL;

			ah->data[ah->pos++] = (char)c;
			pos = ah->lextable_pos;

#if defined(LWS_WITH_CUSTOM_HEADERS)
			if (!wsi->mux_substream && pos < 0 && c == ':') {
#if defined(_DEBUG)
				char dotstar[64];
				int uhlen;
#endif

				/*
				 * process unknown headers
				 *
				 * register us in the unknown hdr ll
				 */

				if (!ah->unk_ll_head)
					ah->unk_ll_head = ah->unk_pos;

				if (ah->unk_ll_tail)
					lws_ser_wu32be(
				(uint8_t *)&ah->data[ah->unk_ll_tail + UHO_LL],
						       ah->unk_pos);

				ah->unk_ll_tail = ah->unk_pos;

#if defined(_DEBUG)
				uhlen = (int)(ah->pos - (ah->unk_pos + UHO_NAME));
				lws_strnncpy(dotstar,
					&ah->data[ah->unk_pos + UHO_NAME],
					uhlen, sizeof(dotstar));
				lwsl_debug("%s: unk header %d '%s'\n",
					    __func__,
					    ah->pos - (ah->unk_pos + UHO_NAME),
					    dotstar);
#endif

				/* set the unknown header name part length */

				lws_ser_wu16be((uint8_t *)&ah->data[ah->unk_pos],
					       (uint16_t)((ah->pos - ah->unk_pos) - UHO_NAME));

				ah->unk_value_pos = ah->pos;

				/*
				 * collect whatever's coming for the unknown header
				 * argument until the next CRLF
				 */
				ah->parser_state = WSI_TOKEN_UNKNOWN_VALUE_PART;
				break;
			}
#endif
			if (pos < 0)
				break;

			while (1) {
				if (lextable_h1[pos] & (1 << 7)) {
					/* 1-byte, fail on mismatch */
					if ((lextable_h1[pos] & 0x7f) != c) {
nope:
						ah->lextable_pos = -1;
						break;
					}
					/* fall thru */
					pos++;
					if (lextable_h1[pos] == FAIL_CHAR)
						goto nope;

					ah->lextable_pos = (int16_t)pos;
					break;
				}

				if (lextable_h1[pos] == FAIL_CHAR)
					goto nope;

				/* b7 = 0, end or 3-byte */
				if (lextable_h1[pos] < FAIL_CHAR) {
					if (!wsi->mux_substream) {
						/*
						 * We hit a terminal marker, so
						 * we recognized this header...
						 * drop the speculative name
						 * part storage
						 */
						ah->pos = ah->unk_pos;
						ah->unk_pos = 0;
					}

					ah->lextable_pos = (int16_t)pos;
					break;
				}

				if (lextable_h1[pos] == c) { /* goto */
					ah->lextable_pos = (int16_t)(pos +
						(lextable_h1[pos + 1]) +
						(lextable_h1[pos + 2] << 8));
					break;
				}

				/* fall thru goto */
				pos += 3;
				/* continue */
			}

			/*
			 * If it's h1, server needs to be on the look out for
			 * unknown methods...
			 */
			if (ah->lextable_pos < 0 && lwsi_role_h1(wsi) &&
			    lwsi_role_server(wsi)) {
				/*
				 * this is not a header we know about... did
				 * we get a valid method (GET, POST etc)
				 * already, or is this the bogus method?
				 */
				for (m = 0; m < LWS_ARRAY_SIZE(methods); m++)
					if (ah->frag_index[methods[m]]) {
						/*
						 * already had the method
						 */
#if !defined(LWS_WITH_CUSTOM_HEADERS)
						ah->parser_state = WSI_TOKEN_SKIPPING;
#endif
						if (wsi->mux_substream)
							ah->parser_state = WSI_TOKEN_SKIPPING;
						break;
					}

				if (m != LWS_ARRAY_SIZE(methods)) {
#if defined(LWS_WITH_CUSTOM_HEADERS)
					/*
					 * We have the method, this is just an
					 * unknown header then
					 */
					if (!wsi->mux_substream)
						goto unknown_hdr;
					else
						break;
#else
					break;
#endif
				}
				/*
				 * ...it's an unknown http method from a client
				 * in fact, it cannot be valid http.
				 *
				 * Are we set up to transition to another role
				 * in these cases?
				 */
				if (lws_check_opt(wsi->a.vhost->options,
		    LWS_SERVER_OPTION_FALLBACK_TO_APPLY_LISTEN_ACCEPT_CONFIG)) {
					lwsl_notice("%s: http fail fallback\n",
						    __func__);
					 /* transition to other role */
					return LPR_DO_FALLBACK;
				}

				lwsl_info("Unknown method - dropping\n");
				goto forbid;
			}
			if (ah->lextable_pos < 0) {
				/*
				 * It's not a header that lws knows about...
				 */
#if defined(LWS_WITH_CUSTOM_HEADERS)
				if (!wsi->mux_substream)
					goto unknown_hdr;
#endif
				/*
				 * ...otherwise for a client, let him ignore
				 * unknown headers coming from the server
				 */
				ah->parser_state = WSI_TOKEN_SKIPPING;
				break;
			}

			if (lextable_h1[ah->lextable_pos] < FAIL_CHAR) {
				/* terminal state */

				n = ((unsigned int)lextable_h1[ah->lextable_pos] << 8) |
						lextable_h1[ah->lextable_pos + 1];

				lwsl_parser("known hdr %d\n", n);
				for (m = 0; m < LWS_ARRAY_SIZE(methods); m++)
					if (n == methods[m] &&
					    ah->frag_index[methods[m]]) {
						lwsl_warn("Duplicated method\n");
						return LPR_FAIL;
					}

				if (!wsi->mux_substream) {
					/*
					 * Whether we are collecting unknown names or not,
					 * if we matched an internal header we can dispense
					 * with the header name part we were keeping
					 */
					ah->pos = ah->unk_pos;
					ah->unk_pos = 0;
				}

#if defined(LWS_ROLE_WS)
				/*
				 * WSORIGIN is protocol equiv to ORIGIN,
				 * JWebSocket likes to send it, map to ORIGIN
				 */
				if (n == WSI_TOKEN_SWORIGIN)
					n = WSI_TOKEN_ORIGIN;
#endif

				ah->parser_state = (uint8_t)
							(WSI_TOKEN_GET_URI + n);
				ah->ups = URIPS_IDLE;

				if (context->token_limits)
					ah->current_token_limit = context->
						token_limits->token_limit[
							      ah->parser_state];
				else
					ah->current_token_limit =
						wsi->a.context->max_http_header_data;

				if (ah->parser_state == WSI_TOKEN_CHALLENGE)
					goto set_parsing_complete;

				goto start_fragment;
			}
			break;

#if defined(LWS_WITH_CUSTOM_HEADERS)
unknown_hdr:
			//ah->parser_state = WSI_TOKEN_SKIPPING;
			//break;
			if (!wsi->mux_substream)
				break;
#endif

start_fragment:
			ah->nfrag++;
excessive:
			if (ah->nfrag == LWS_ARRAY_SIZE(ah->frags)) {
				lwsl_warn("More hdr frags than we can deal with\n");
				return LPR_FAIL;
			}

			ah->frags[ah->nfrag].offset = ah->pos;
			ah->frags[ah->nfrag].len = 0;
			ah->frags[ah->nfrag].nfrag = 0;
			ah->frags[ah->nfrag].flags = 2;

			n = ah->frag_index[ah->parser_state];
			if (!n) { /* first fragment */
				ah->frag_index[ah->parser_state] = ah->nfrag;
				ah->hdr_token_idx = ah->parser_state;
				break;
			}
			/* continuation */
			while (ah->frags[n].nfrag)
				n = ah->frags[n].nfrag;
			ah->frags[n].nfrag = ah->nfrag;

			if (issue_char(wsi, ' ') < 0)
				return LPR_FAIL;
			break;

			/* skipping arg part of a name we didn't recognize */
		case WSI_TOKEN_SKIPPING:
			lwsl_parser("WSI_TOKEN_SKIPPING '%c'\n", c);

			if (c == '\x0a') {
				/* broken peer */
				ah->parser_state = WSI_TOKEN_NAME_PART;
				ah->unk_pos = 0;
				ah->lextable_pos = 0;
			}

			if (c == '\x0d')
				ah->parser_state = WSI_TOKEN_SKIPPING_SAW_CR;
			break;

		case WSI_TOKEN_SKIPPING_SAW_CR:
			lwsl_parser("WSI_TOKEN_SKIPPING_SAW_CR '%c'\n", c);
			if (ah->ues != URIES_IDLE)
				goto forbid;
			if (c == '\x0a') {
				ah->parser_state = WSI_TOKEN_NAME_PART;
				ah->unk_pos = 0;
				ah->lextable_pos = 0;
			} else
				ah->parser_state = WSI_TOKEN_SKIPPING;
			break;
			/* we're done, ignore anything else */

		case WSI_PARSING_COMPLETE:
			lwsl_parser("WSI_PARSING_COMPLETE '%c'\n", c);
			break;
		}

	} while (*len);

	return LPR_OK;

set_parsing_complete:
	if (ah->ues != URIES_IDLE)
		goto forbid;

	if (lws_hdr_total_length(wsi, WSI_TOKEN_UPGRADE)) {
#if defined(LWS_ROLE_WS)
		const char *pv = lws_hdr_simple_ptr(wsi, WSI_TOKEN_VERSION);
		if (pv)
			wsi->rx_frame_type = (char)atoi(pv);

		lwsl_parser("v%02d hdrs done\n", wsi->rx_frame_type);
#endif
	}
	ah->parser_state = WSI_PARSING_COMPLETE;
	wsi->hdr_parsing_completed = 1;

	return LPR_OK;

forbid:
	lwsl_info(" forbidding on uri sanitation\n");
#if defined(LWS_WITH_SERVER)
	lws_return_http_status(wsi, HTTP_STATUS_FORBIDDEN, NULL);
#endif

	return LPR_FORBIDDEN;
}